

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.cpp
# Opt level: O0

bool __thiscall CEObservation::UpdateCoordinates(CEObservation *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  CESkyCoord *in_RDI;
  double dVar3;
  CEObservation *in_stack_ffffffffffffffa8;
  CESkyCoord *other;
  CESkyCoord local_38;
  
  bVar2 = NeedsUpdate(in_stack_ffffffffffffffa8);
  if (bVar2) {
    pp_Var1 = (in_RDI->xcoord_)._vptr_CEAngle;
    other = &local_38;
    (**(code **)(*pp_Var1 + 0x40))
              (other,pp_Var1,(in_RDI->xcoord_).angle_,(in_RDI->ycoord_)._vptr_CEAngle);
    CESkyCoord::operator=(in_RDI,other);
    CESkyCoord::~CESkyCoord(in_RDI);
    dVar3 = CEDate::operator_cast_to_double((CEDate *)0x13626d);
    (in_RDI->ycoord_).angle_ = dVar3;
  }
  return true;
}

Assistant:

bool CEObservation::UpdateCoordinates()
{
    if (NeedsUpdate()) {
        // Get the coordinates and date
        cached_coords_ = body_->ObservedCoords(*date_, *observer_);
        cached_date_   = *date_;
    }
    return true ;
}